

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O3

void __thiscall
MOS::MOS6522::
MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
::set_control_line_input
          (MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
           *this,Port port,Line line,bool value)

{
  HalfCycles *pHVar1;
  VIAPortHandler *pVVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  anon_struct_2_1_a83d3e1f *paVar6;
  bool bVar7;
  
  if (line == Two) {
    paVar6 = (anon_struct_2_1_a83d3e1f *)
             ((this->super_MOS6522Storage).control_inputs_[port].lines + 1);
    if (paVar6->lines[0] != value) {
      bVar5 = (this->super_MOS6522Storage).registers_.peripheral_control;
      bVar4 = 0x80;
      if (port == A) {
        bVar4 = 8;
      }
      if ((bVar4 & bVar5) == 0) {
        bVar4 = 0x40;
        if (port == A) {
          bVar4 = 4;
        }
        if (((bVar4 & bVar5) == 0) != value) {
          bVar5 = 8;
          if (port == A) {
            bVar5 = 1;
          }
          bVar5 = bVar5 | (this->super_MOS6522Storage).registers_.interrupt_flags;
          (this->super_MOS6522Storage).registers_.interrupt_flags = bVar5;
          bVar7 = (bVar5 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x7f) != 0;
          if ((this->super_MOS6522Storage).last_posted_interrupt_status_ != bVar7) {
            (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar7;
            pVVar2 = this->bus_handler_;
            lVar3 = (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_;
            (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
            pHVar1 = &pVVar2->audio_->time_since_update;
            (pHVar1->super_WrappedInt<HalfCycles>).length_ =
                 (pHVar1->super_WrappedInt<HalfCycles>).length_ + lVar3 * 5;
            Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::
            update_interrupt_input(pVVar2->machine_);
          }
        }
      }
    }
  }
  else {
    if (line != One) {
      return;
    }
    paVar6 = (this->super_MOS6522Storage).control_inputs_ + port;
    if (paVar6->lines[0] != value) {
      if ((this->super_MOS6522Storage).handshake_modes_[port] == Handshake) {
        set_control_line_output(this,port,Two,On);
      }
      bVar4 = 0x10;
      bVar5 = 1;
      if (port != A) {
        bVar5 = bVar4;
      }
      if (((bVar5 & (this->super_MOS6522Storage).registers_.peripheral_control) == 0) != value) {
        if (port == A) {
          bVar4 = 2;
        }
        bVar4 = bVar4 | (this->super_MOS6522Storage).registers_.interrupt_flags;
        (this->super_MOS6522Storage).registers_.interrupt_flags = bVar4;
        bVar7 = (bVar4 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x7f) != 0;
        if ((this->super_MOS6522Storage).last_posted_interrupt_status_ != bVar7) {
          (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar7;
          pVVar2 = this->bus_handler_;
          lVar3 = (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_;
          (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
          pHVar1 = &pVVar2->audio_->time_since_update;
          (pHVar1->super_WrappedInt<HalfCycles>).length_ =
               (pHVar1->super_WrappedInt<HalfCycles>).length_ + lVar3 * 5;
          Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::
          update_interrupt_input(pVVar2->machine_);
        }
      }
      if (port == B) {
        bVar5 = (this->super_MOS6522Storage).registers_.auxiliary_control >> 2 & 7;
        if (bVar5 == 7) {
          if (!value) {
            shift_out(this);
          }
        }
        else if ((bVar5 == 3) && (value)) {
          shift_in(this);
        }
      }
    }
  }
  paVar6->lines[0] = value;
  return;
}

Assistant:

void MOS6522<T>::set_control_line_input(Port port, Line line, bool value) {
	switch(line) {
		case Line::One:
			if(value != control_inputs_[port].lines[line]) {
				// In handshake mode, any transition on C[A/B]1 sets output high on C[A/B]2.
				if(handshake_modes_[port] == HandshakeMode::Handshake) {
					set_control_line_output(port, Line::Two, LineState::On);
				}

				// Set the proper transition interrupt bit if enabled.
				if(value == !!(registers_.peripheral_control & (port ? 0x10 : 0x01))) {
					registers_.interrupt_flags |= port ? InterruptFlag::CB1ActiveEdge : InterruptFlag::CA1ActiveEdge;
					reevaluate_interrupts();
				}

				// If this is a transition on CB1, consider updating the shift register.
				// TODO: and at least one full clock since the shift register was written?
				if(port == Port::B) {
					switch(shift_mode()) {
						default:													break;
						case ShiftMode::InUnderCB1:		if(value)	shift_in();		break;	// Shifts in are captured on a low-to-high transition.
						case ShiftMode::OutUnderCB1:	if(!value)	shift_out();	break;	// Shifts out are updated on a high-to-low transition.
					}
				}
			}
			control_inputs_[port].lines[line] = value;
		break;

		case Line::Two:
			if(	value != control_inputs_[port].lines[line] &&						// i.e. value has changed ...
				!(registers_.peripheral_control & (port ? 0x80 : 0x08)) &&			// ... and line is input ...
				value == !!(registers_.peripheral_control & (port ? 0x40 : 0x04))	// ... and it's either high or low, as required
			) {
				registers_.interrupt_flags |= port ? InterruptFlag::CB2ActiveEdge : InterruptFlag::CA2ActiveEdge;
				reevaluate_interrupts();
			}
			control_inputs_[port].lines[line] = value;
		break;
	}
}